

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

int __thiscall duckdb_re2::DFA::BuildAllStates(DFA *this,DFAStateCallback *cb)

{
  Prog *pPVar1;
  long lVar2;
  pointer piVar3;
  bool bVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  size_type __n;
  int *piVar10;
  long lVar11;
  ulong uVar12;
  State *ns;
  vector<int,_std::allocator<int>_> output;
  vector<int,_std::allocator<int>_> input;
  RWLocker l;
  unordered_map<duckdb_re2::DFA::State_*,_int,_std::hash<duckdb_re2::DFA::State_*>,_std::equal_to<duckdb_re2::DFA::State_*>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>_>
  m;
  deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_> q;
  undefined4 local_174;
  DFAStateCallback *local_170;
  State *local_168;
  State *local_160;
  _Vector_base<int,_std::allocator<int>_> local_158;
  _Vector_base<int,_std::allocator<int>_> local_140;
  ulong local_128;
  RWLocker local_120;
  _Hashtable<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_110;
  _Deque_base<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_> local_d8;
  SearchParams local_88;
  
  iVar9 = 0;
  if (this->init_failed_ == false) {
    local_120.mu_ = &this->cache_mutex_;
    iVar9 = 0;
    local_120.writing_ = false;
    local_170 = cb;
    Mutex::ReaderLock(local_120.mu_);
    local_88.text.data_ = (const_pointer)0x0;
    local_88.text.size_ = 0;
    local_88.start = (State *)0x0;
    local_88.context.data_ = (const_pointer)0x0;
    local_88.context.size_ = 0;
    local_88.failed = false;
    local_88.ep = (char *)0x0;
    local_88.matches = (SparseSet *)0x0;
    local_88.anchored = false;
    local_88.can_prefix_accel = false;
    local_88.want_earliest_match = false;
    local_88.run_forward = false;
    local_88.cache_lock = &local_120;
    bVar4 = AnalyzeSearch(this,&local_88);
    if (bVar4 && (State *)0x1 < local_88.start) {
      local_110._M_buckets = &local_110._M_single_bucket;
      local_110._M_bucket_count = 1;
      local_110._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_110._M_element_count = 0;
      local_110._M_rehash_policy._M_max_load_factor = 1.0;
      local_110._M_rehash_policy._M_next_resize = 0;
      local_110._M_single_bucket = (__node_base_ptr)0x0;
      std::_Deque_base<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>::
      _Deque_base(&local_d8);
      local_140._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)local_110._M_element_count;
      std::
      _Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<duckdb_re2::DFA::State*&,int>
                ((_Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&local_110,&local_88.start);
      std::deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>::push_back
                ((deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_> *)
                 &local_d8,&local_88.start);
      __n = (long)this->prog_->bytemap_range_ + 1;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_140,__n,(allocator_type *)&local_158);
      pPVar1 = this->prog_;
      iVar9 = 0;
      while (iVar9 < 0x100) {
        iVar8 = iVar9 + -1;
        lVar11 = (long)iVar9;
        do {
          if (lVar11 == 0xff) {
            iVar8 = 0xff;
            break;
          }
          iVar8 = iVar8 + 1;
          lVar2 = lVar11 + 1;
          lVar11 = lVar11 + 1;
        } while (pPVar1->bytemap_[lVar2] == pPVar1->bytemap_[iVar9]);
        *(int *)(CONCAT44(local_140._M_impl.super__Vector_impl_data._M_start._4_4_,
                          local_140._M_impl.super__Vector_impl_data._M_start._0_4_) +
                (ulong)pPVar1->bytemap_[iVar9] * 4) = iVar8;
        iVar9 = iVar8 + 1;
      }
      *(undefined4 *)
       (CONCAT44(local_140._M_impl.super__Vector_impl_data._M_start._4_4_,
                 local_140._M_impl.super__Vector_impl_data._M_start._0_4_) +
       (long)pPVar1->bytemap_range_ * 4) = 0x100;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_158,__n,(allocator_type *)&local_160);
      uVar12 = 0;
      do {
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
        local_168 = *local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_128 = uVar12;
        std::deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>::pop_front
                  ((deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_> *)
                   &local_d8);
        piVar3 = local_140._M_impl.super__Vector_impl_data._M_finish;
        for (piVar10 = (int *)CONCAT44(local_140._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_140._M_impl.super__Vector_impl_data._M_start._0_4_);
            uVar12 = local_128, piVar10 != piVar3; piVar10 = piVar10 + 1) {
          iVar9 = *piVar10;
          local_160 = RunStateOnByteUnlocked(this,local_168,iVar9);
          if (local_160 == (State *)0x1) {
            if (iVar9 == 0x100) {
              uVar7 = this->prog_->bytemap_range_;
            }
            else {
              uVar7 = (uint)this->prog_->bytemap_[iVar9];
            }
            local_158._M_impl.super__Vector_impl_data._M_start[(int)uVar7] = -1;
          }
          else {
            if (local_160 == (State *)0x0) {
              uVar12 = CONCAT71((int7)((ulong)piVar10 >> 8),1);
              break;
            }
            iVar5 = std::
                    _Hashtable<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&local_110,&local_160);
            if (iVar5.
                super__Node_iterator_base<std::pair<duckdb_re2::DFA::State_*const,_int>,_false>.
                _M_cur == (__node_type *)0x0) {
              local_174 = (int)local_110._M_element_count;
              std::
              _Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<duckdb_re2::DFA::State*&,int>
                        ((_Hashtable<duckdb_re2::DFA::State*,std::pair<duckdb_re2::DFA::State*const,int>,std::allocator<std::pair<duckdb_re2::DFA::State*const,int>>,std::__detail::_Select1st,std::equal_to<duckdb_re2::DFA::State*>,std::hash<duckdb_re2::DFA::State*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_110,&local_160,&local_174);
              std::deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>::
              push_back((deque<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>
                         *)&local_d8,&local_160);
            }
            pmVar6 = std::__detail::
                     _Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)&local_110,&local_160);
            if (iVar9 == 0x100) {
              uVar7 = this->prog_->bytemap_range_;
            }
            else {
              uVar7 = (uint)this->prog_->bytemap_[iVar9];
            }
            local_158._M_impl.super__Vector_impl_data._M_start[(int)uVar7] = *pmVar6;
          }
        }
        if (*(long *)(local_170 + 0x10) != 0) {
          piVar10 = local_158._M_impl.super__Vector_impl_data._M_start;
          if ((uVar12 & 1) != 0) {
            piVar10 = (int *)0x0;
          }
          if (local_168 == (State *)0x2) {
            bVar4 = true;
          }
          else {
            bVar4 = (bool)(*(byte *)((long)&local_168->flag_ + 1) & 1);
          }
          std::function<void_(const_int_*,_bool)>::operator()(local_170,piVar10,bVar4);
        }
      } while ((uVar12 & 1) == 0);
      iVar9 = (int)local_110._M_element_count;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_158);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_140);
      std::_Deque_base<duckdb_re2::DFA::State_*,_std::allocator<duckdb_re2::DFA::State_*>_>::
      ~_Deque_base(&local_d8);
      std::
      _Hashtable<duckdb_re2::DFA::State_*,_std::pair<duckdb_re2::DFA::State_*const,_int>,_std::allocator<std::pair<duckdb_re2::DFA::State_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<duckdb_re2::DFA::State_*>,_std::hash<duckdb_re2::DFA::State_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_110);
    }
    RWLocker::~RWLocker(&local_120);
  }
  return iVar9;
}

Assistant:

int DFA::BuildAllStates(const Prog::DFAStateCallback& cb) {
  if (!ok())
    return 0;

  // Pick out start state for unanchored search
  // at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(StringPiece(), StringPiece(), &l);
  params.anchored = false;
  if (!AnalyzeSearch(&params) ||
      params.start == NULL ||
      params.start == DeadState)
    return 0;

  // Add start state to work queue.
  // Note that any State* that we handle here must point into the cache,
  // so we can simply depend on pointer-as-a-number hashing and equality.
  std::unordered_map<State*, int> m;
  std::deque<State*> q;
  m.emplace(params.start, static_cast<int>(m.size()));
  q.push_back(params.start);

  // Compute the input bytes needed to cover all of the next pointers.
  int nnext = prog_->bytemap_range() + 1;  // + 1 for kByteEndText slot
  std::vector<int> input(nnext);
  for (int c = 0; c < 256; c++) {
    int b = prog_->bytemap()[c];
    while (c < 256-1 && prog_->bytemap()[c+1] == b)
      c++;
    input[b] = c;
  }
  input[prog_->bytemap_range()] = kByteEndText;

  // Scratch space for the output.
  std::vector<int> output(nnext);

  // Flood to expand every state.
  bool oom = false;
  while (!q.empty()) {
    State* s = q.front();
    q.pop_front();
    for (int c : input) {
      State* ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        oom = true;
        break;
      }
      if (ns == DeadState) {
        output[ByteMap(c)] = -1;
        continue;
      }
      if (m.find(ns) == m.end()) {
        m.emplace(ns, static_cast<int>(m.size()));
        q.push_back(ns);
      }
      output[ByteMap(c)] = m[ns];
    }
    if (cb)
      cb(oom ? NULL : output.data(),
         s == FullMatchState || s->IsMatch());
    if (oom)
      break;
  }

  return static_cast<int>(m.size());
}